

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modes.c
# Opt level: O2

void cf_cbc_encrypt(cf_cbc *ctx,uint8_t *input,uint8_t *output,size_t blocks)

{
  uint8_t *y;
  size_t len;
  long lVar1;
  bool bVar2;
  uint8_t buf [16];
  uint8_t local_48 [24];
  
  len = ctx->prp->blocksz;
  y = ctx->block;
  lVar1 = 0;
  while (bVar2 = blocks != 0, blocks = blocks - 1, bVar2) {
    xor_bb(local_48,input + lVar1,y,len);
    (*ctx->prp->encrypt)(ctx->prpctx,local_48,y);
    memcpy(output + lVar1,y,len);
    lVar1 = lVar1 + len;
  }
  return;
}

Assistant:

void cf_cbc_encrypt(cf_cbc *ctx, const uint8_t *input, uint8_t *output, size_t blocks)
{
  uint8_t buf[CF_MAXBLOCK];
  size_t nblk = ctx->prp->blocksz;

  while (blocks--)
  {
    xor_bb(buf, input, ctx->block, nblk);
    ctx->prp->encrypt(ctx->prpctx, buf, ctx->block);
    memcpy(output, ctx->block, nblk);
    input += nblk;
    output += nblk;
  }
}